

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

int __thiscall MetaCommand::GetValueAsInt(MetaCommand *this,string *optionName,string *fieldName)

{
  __type _Var1;
  int iVar2;
  pointer __lhs;
  pointer __lhs_00;
  string fieldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__cxx11::string::string((string *)&bStack_48,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&bStack_48);
  }
  __lhs_00 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (__lhs_00 ==
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar2 = 0;
LAB_00116768:
      std::__cxx11::string::~string((string *)&bStack_48);
      return iVar2;
    }
    _Var1 = std::operator==(&__lhs_00->name,optionName);
    if (_Var1) {
      for (__lhs = (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __lhs != (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        _Var1 = std::operator==(&__lhs->name,&bStack_48);
        if (_Var1) {
          iVar2 = atoi((__lhs->value)._M_dataplus._M_p);
          goto LAB_00116768;
        }
      }
    }
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

int MetaCommand::GetValueAsInt(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return atoi((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}